

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lines.hpp
# Opt level: O2

void __thiscall
just::lines::
iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
::next_char(iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            *this)

{
  char *pcVar1;
  
  if (this->_at_end == true) {
    __assert_fail("!_at_end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/lines.hpp"
                  ,0x96,
                  "void just::lines::iterator<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::next_char() [InputIt = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, KeepNewlines = false]"
                 );
  }
  pcVar1 = (this->_at)._M_current;
  if (pcVar1 != (this->_end)._M_current) {
    this->_last_char = *pcVar1;
    (this->_at)._M_current = pcVar1 + 1;
    return;
  }
  __assert_fail("_at != _end",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/lines.hpp"
                ,0x97,
                "void just::lines::iterator<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::next_char() [InputIt = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, KeepNewlines = false]"
               );
}

Assistant:

void next_char()
      {
        assert(!_at_end);
        assert(_at != _end);

        _last_char = *_at;
        ++_at;
      }